

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

ply_type __thiscall
gvr::PLYReader::getTypeOfProperty(PLYReader *this,string *elem_name,string *prop_name)

{
  PLYElement *this_00;
  PLYProperty *pPVar1;
  ply_type pVar2;
  
  this_00 = findElement(this,elem_name);
  pVar2 = ply_none;
  if (this_00 != (PLYElement *)0x0) {
    pPVar1 = PLYElement::findProperty(this_00,prop_name);
    pVar2 = ply_none;
    if (pPVar1 != (PLYProperty *)0x0) {
      pVar2 = pPVar1->tvalue;
    }
  }
  return pVar2;
}

Assistant:

ply_type PLYReader::getTypeOfProperty(const std::string &elem_name,
                                      const std::string &prop_name) const
{
  PLYElement *elem=findElement(elem_name);

  if (elem != 0)
  {
    PLYProperty *prop=elem->findProperty(prop_name);

    if (prop != 0)
    {
      return prop->getValueType();
    }
  }

  return ply_none;
}